

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tattoo.c
# Opt level: O0

void do_brands(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *ch_00;
  CHAR_DATA *pCVar2;
  OBJ_DATA *obj_00;
  CHAR_DATA *in_RDI;
  OBJ_DATA *objj;
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  char arg1 [4608];
  CHAR_DATA *in_stack_ffffffffffffedc8;
  char *in_stack_ffffffffffffedd0;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  char *in_stack_ffffffffffffede0;
  char in_stack_ffffffffffffede8;
  undefined7 in_stack_ffffffffffffede9;
  OBJ_DATA *in_stack_ffffffffffffedf0;
  undefined1 in_stack_ffffffffffffee13;
  int in_stack_ffffffffffffee14;
  OBJ_DATA *in_stack_ffffffffffffee18;
  CHAR_DATA *in_stack_ffffffffffffee20;
  int in_stack_ffffffffffffee7c;
  OBJ_INDEX_DATA *in_stack_ffffffffffffee80;
  
  if ((in_RDI->level < 0x35) || (bVar1 = is_npc(in_stack_ffffffffffffedc8), bVar1)) {
    send_to_char(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
    return;
  }
  one_argument(in_stack_ffffffffffffedd0,(char *)in_stack_ffffffffffffedc8);
  if (in_stack_ffffffffffffede8 == '\0') {
    send_to_char(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
    return;
  }
  ch_00 = get_char_world((CHAR_DATA *)arg1._4536_8_,(char *)arg1._4528_8_);
  if (ch_00 == (CHAR_DATA *)0x0) {
    send_to_char((char *)0x0,in_stack_ffffffffffffedd8);
    return;
  }
  if (in_RDI == ch_00) {
    send_to_char((char *)ch_00,in_stack_ffffffffffffedd8);
    return;
  }
  pCVar2 = (CHAR_DATA *)get_eq_char(ch_00,0x13);
  if (pCVar2 != (CHAR_DATA *)0x0) {
    send_to_char((char *)ch_00,pCVar2);
    return;
  }
  pCVar2 = (CHAR_DATA *)get_eq_char(in_RDI,0x13);
  if (pCVar2 != (CHAR_DATA *)0x0) {
    obj_00 = create_object(in_stack_ffffffffffffee80,in_stack_ffffffffffffee7c);
    clone_object(in_stack_ffffffffffffedf0,
                 (OBJ_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    obj_to_char(obj_00,in_stack_ffffffffffffedc8);
    equip_char(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,in_stack_ffffffffffffee14,
               (bool)in_stack_ffffffffffffee13);
    act((char *)ch_00,pCVar2,obj_00,in_stack_ffffffffffffedc8,0);
    act((char *)ch_00,pCVar2,obj_00,in_stack_ffffffffffffedc8,0);
    act((char *)ch_00,pCVar2,obj_00,in_stack_ffffffffffffedc8,0);
    return;
  }
  send_to_char((char *)ch_00,(CHAR_DATA *)0x0);
  return;
}

Assistant:

void do_brands(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	OBJ_DATA *objj;

	if (ch->level < 53 || is_npc(ch))
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: tattoo <char>\n\r", ch);
		return;
	}

	if ((victim = get_char_world(ch, arg1)) == nullptr)
	{
		send_to_char("They aren't playing.\n\r", ch);
		return;
	}

	/*
	if (is_npc(victim))
	{
		send_to_char("Trying to tattoo a mob?\n\r", ch);
		return;
	}
	*/

	if (ch == victim)
	{
		send_to_char("Trying to tattoo yourself?\n\r", ch);
		return;
	}

	if ((obj = get_eq_char(victim, WEAR_BRAND)) != nullptr)
	{
		send_to_char("That person already has a tattoo.\n\r", ch);
		return;
	}

	if ((obj = get_eq_char(ch, WEAR_BRAND)) != nullptr)
	{
		objj = create_object(obj->pIndexData, 0);
		clone_object(obj, objj);
		obj_to_char(objj, victim);
		equip_char(victim, objj, WEAR_BRAND, true);

		act("You mark $N with $p!", ch, objj, victim, TO_CHAR);
		act("$n marks you with $p!", ch, objj, victim, TO_VICT);
		act("$n marks $N with $p!", ch, objj, victim, TO_NOTVICT);
		return;
	}

	send_to_char("You don't have a brand yourself.\n\r", ch);
}